

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O1

void __thiscall
supermap::BloomFilter<supermap::Key<1UL>_>::BloomFilter
          (BloomFilter<supermap::Key<1UL>_> *this,double errorProbability,
          unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *hasher)

{
  result_type *prVar1;
  uint uVar2;
  long lVar3;
  result_type rVar4;
  IllegalArgumentException *this_00;
  ulong uVar5;
  unsigned_long *seed;
  result_type *prVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  double dVar7;
  mt19937_64 rnd;
  anon_union_5000_2_650ea050_for_random_device_0 local_1d80;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  (this->super_Filter<supermap::Key<1UL>_>).super_Cloneable<supermap::Filter<supermap::Key<1UL>_>_>.
  _vptr_Cloneable = (_func_int **)&PTR_clone_00205ce0;
  (this->hasher_)._M_t.
  super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
  super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
  super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl =
       (hasher->_M_t).
       super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
       super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
       super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl;
  (hasher->_M_t).super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>.
  _M_t.super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
  super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl = (Hasher *)0x0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->wasReserved_ = false;
  (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  if ((0.0 < errorProbability) && (errorProbability <= 1.0)) {
    dVar7 = log2(errorProbability);
    dVar7 = dVar7 * -1.44;
    if (dVar7 <= 1.0) {
      dVar7 = 1.0;
    }
    this->sizeMultiplier_ = dVar7;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->seeds_,1);
    std::random_device::random_device((random_device *)&local_1d80.field_0);
    uVar2 = std::random_device::_M_getval();
    local_9f8._M_x[0] = (unsigned_long)uVar2;
    lVar3 = 1;
    uVar5 = local_9f8._M_x[0];
    do {
      uVar5 = (uVar5 >> 0x3e ^ uVar5) * 0x5851f42d4c957f2d + lVar3;
      local_9f8._M_x[lVar3] = uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x138);
    local_9f8._M_p = 0x138;
    std::random_device::_M_fini();
    prVar6 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    prVar1 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (prVar6 != prVar1) {
      do {
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&local_9f8);
        *prVar6 = rVar4;
        prVar6 = prVar6 + 1;
      } while (prVar6 != prVar1);
    }
    return;
  }
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  local_1d80.field_0._M_file = &local_1d80.field_0._M_fd;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d80,"Error probability must be a positive number not bigger than 1",
             "");
  supermap::IllegalArgumentException::IllegalArgumentException
            (this_00,(string *)&local_1d80.field_0);
  __cxa_throw(this_00,&IllegalArgumentException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

explicit BloomFilter(double errorProbability, std::unique_ptr<Hasher> &&hasher) : hasher_(std::move(hasher)) {
        if (errorProbability <= 0 || errorProbability > 1) {
            throw supermap::IllegalArgumentException("Error probability must be a positive number not bigger than 1");
        }
        sizeMultiplier_ = std::max(1.0, -1.44 * std::log2(errorProbability));
        constexpr std::size_t keysSize = io::FixedDeserializedSizeRegister<T>::exactDeserializedSize;
        auto numberOfHashFunctions = std::max(1ul, static_cast<std::size_t>(std::ceil(std::log2(keysSize))));
        seeds_.resize(numberOfHashFunctions);
        std::mt19937_64 rnd(std::random_device{}());
        for (auto &seed : seeds_) {
            seed = rnd();
        }
    }